

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool is_dir_inst(int ch,bool allowrel)

{
  undefined1 uVar1;
  uint uVar2;
  
  uVar2 = ch - 0x61;
  if ((uVar2 < 0x1a) &&
     ((uVar1 = 1, (0x3164809U >> (uVar2 & 0x1f) & 1) != 0 ||
      (uVar1 = allowrel, (0x402036U >> (uVar2 & 0x1f) & 1) != 0)))) {
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool is_dir_inst(int ch, bool allowrel) {
    switch (ch) {
    case INST_D_RIGHT:
    case INST_D_UP:
    case INST_D_LEFT:
    case INST_D_DOWN:
    case INST_D_ORTHOGONAL:
    case INST_D_DIAGONAL:
    case INST_D_OCTILINEAR:
    case INST_D_STATIONARY:
    case INST_D_ABSNUM:
        return true;
    case INST_D_RELNUM:
    case INST_D_CLOCKWISE:
    case INST_D_COUNTERCLOCKWISE:
    case INST_D_FORWARD:
    case INST_D_BACKWARD:
    case INST_D_NORMAL:
        return allowrel;
    default:
        return false;
    }
}